

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

char * __thiscall wabt::Type::GetRefKindName(Type *this)

{
  Enum EVar1;
  
  EVar1 = this->enum_;
  if (EVar1 == Array) {
    return "array";
  }
  if (EVar1 == Struct) {
    return "struct";
  }
  if (EVar1 == FuncRef) {
    return "func";
  }
  if (EVar1 == ExternRef) {
    return "extern";
  }
  return "<invalid>";
}

Assistant:

const char* GetRefKindName() const {
    switch (enum_) {
      case Type::FuncRef:   return "func";
      case Type::ExternRef: return "extern";
      case Type::Struct:    return "struct";
      case Type::Array:     return "array";
      default:              return "<invalid>";
    }
  }